

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

uint64_t read_hex(char **ptr)

{
  int iVar1;
  ulong local_28;
  uint64_t res;
  char *p;
  int v;
  char **ptr_local;
  
  local_28 = 0;
  res = (uint64_t)*ptr;
  while( true ) {
    iVar1 = hex_value((int)*(char *)res);
    if (iVar1 < 0) {
      if ((char *)res != *ptr) {
        *ptr = (char *)(res - 1);
        return local_28;
      }
      __assert_fail("p != *ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x857,"uint64_t read_hex(const char **)");
    }
    if (local_28 >> 0x3c != 0) break;
    local_28 = local_28 * 0x10 + (long)iVar1;
    res = res + 1;
  }
  __assert_fail("(res >> 60) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x854,"uint64_t read_hex(const char **)");
}

Assistant:

static uint64_t read_hex (const char **ptr) {
  int v;
  const char *p;
  uint64_t res = 0;

  for (p = *ptr; (v = hex_value (*p)) >= 0; p++) {
    gen_assert ((res >> 60) == 0);
    res = res * 16 + v;
  }
  gen_assert (p != *ptr);
  *ptr = p - 1;
  return res;
}